

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

void llvm::cl::HideUnrelatedOptions(OptionCategory *Category,SubCommand *Sub)

{
  StringMapEntryBase **ppSVar1;
  size_t sVar2;
  StringMapEntryBase **ppSVar3;
  ulong uVar4;
  
  ppSVar1 = (Sub->OptionsMap).super_StringMapImpl.TheTable;
  uVar4 = (ulong)(Sub->OptionsMap).super_StringMapImpl.NumBuckets;
  ppSVar3 = ppSVar1;
  if (uVar4 != 0) {
    for (; (*ppSVar3 == (StringMapEntryBase *)0x0 ||
           (*ppSVar3 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar3 = ppSVar3 + 1) {
    }
  }
  while (ppSVar3 != ppSVar1 + uVar4) {
    sVar2 = (*ppSVar3)[1].StrLen;
    if (*(OptionCategory **)(sVar2 + 0x48) != &GenericCategory &&
        *(OptionCategory **)(sVar2 + 0x48) != Category) {
      *(ushort *)(sVar2 + 0xc) = (ushort)*(undefined4 *)(sVar2 + 0xc) & 0xff9f | 0x40;
    }
    do {
      do {
        ppSVar3 = ppSVar3 + 1;
      } while (*ppSVar3 == (StringMapEntryBase *)0x0);
    } while (*ppSVar3 == (StringMapEntryBase *)0xfffffffffffffff8);
  }
  return;
}

Assistant:

iterator begin() {
    return iterator(TheTable, NumBuckets == 0);
  }